

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

int xmlFAParseBranch(xmlRegParserCtxtPtr ctxt,xmlRegStatePtr to)

{
  xmlChar xVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int extraout_EAX;
  xmlRegStatePtr pxVar5;
  xmlRegStatePtr from;
  
  from = ctxt->state;
  iVar2 = xmlFAParsePiece(ctxt);
  if (iVar2 == 0) {
    iVar3 = xmlFAGenerateEpsilonTransition(ctxt,from,to);
  }
  else {
    xVar1 = *ctxt->cur;
    pxVar5 = to;
    if (((xVar1 != '\0') && (xVar1 != '|')) && (xVar1 != ')')) {
      pxVar5 = (xmlRegStatePtr)0x0;
    }
    iVar3 = xmlFAGenerateTransitions(ctxt,from,pxVar5,ctxt->atom);
    if (iVar3 < 0) goto LAB_0017880e;
    from = ctxt->state;
    ctxt->atom = (xmlRegAtomPtr)0x0;
  }
  uVar4 = CONCAT31((int3)((uint)iVar3 >> 8),iVar2 == 0);
  while( true ) {
    if ((((uVar4 & 1) != 0) || (ctxt->error != 0)) || (uVar4 = xmlFAParsePiece(ctxt), uVar4 == 0)) {
      return uVar4;
    }
    xVar1 = *ctxt->cur;
    pxVar5 = to;
    if (((xVar1 != '\0') && (xVar1 != '|')) && (xVar1 != ')')) {
      pxVar5 = (xmlRegStatePtr)0x0;
    }
    iVar2 = xmlFAGenerateTransitions(ctxt,from,pxVar5,ctxt->atom);
    if (iVar2 < 0) break;
    from = ctxt->state;
    ctxt->atom = (xmlRegAtomPtr)0x0;
    uVar4 = 0;
  }
LAB_0017880e:
  xmlRegFreeAtom(ctxt->atom);
  ctxt->atom = (xmlRegAtomPtr)0x0;
  return extraout_EAX;
}

Assistant:

static int
xmlFAParseBranch(xmlRegParserCtxtPtr ctxt, xmlRegStatePtr to) {
    xmlRegStatePtr previous;
    int ret;

    previous = ctxt->state;
    ret = xmlFAParsePiece(ctxt);
    if (ret == 0) {
        /* Empty branch */
	xmlFAGenerateEpsilonTransition(ctxt, previous, to);
    } else {
	if (xmlFAGenerateTransitions(ctxt, previous,
	        (CUR=='|' || CUR==')' || CUR==0) ? to : NULL,
                ctxt->atom) < 0) {
            xmlRegFreeAtom(ctxt->atom);
            ctxt->atom = NULL;
	    return(-1);
        }
	previous = ctxt->state;
	ctxt->atom = NULL;
    }
    while ((ret != 0) && (ctxt->error == 0)) {
	ret = xmlFAParsePiece(ctxt);
	if (ret != 0) {
	    if (xmlFAGenerateTransitions(ctxt, previous,
	            (CUR=='|' || CUR==')' || CUR==0) ? to : NULL,
                    ctxt->atom) < 0) {
                xmlRegFreeAtom(ctxt->atom);
                ctxt->atom = NULL;
                return(-1);
            }
	    previous = ctxt->state;
	    ctxt->atom = NULL;
	}
    }
    return(0);
}